

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ShapeFunctionsDerivativeZ
          (ChElementHexaANCF_3813 *this,ShapeVector *Nz,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  
  dVar1 = (2.0 / (this->m_InertFlexVec).m_data[2]) * 0.125;
  dVar2 = (1.0 - x) * dVar1;
  dVar3 = (1.0 - y) * dVar2;
  dVar1 = (x + 1.0) * dVar1;
  dVar4 = (y + 1.0) * dVar1;
  dVar2 = (y + 1.0) * dVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar4;
  auVar7 = vunpcklpd_avx(auVar8,auVar7);
  dVar1 = (1.0 - y) * dVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar6 = vunpcklpd_avx(auVar10,auVar6);
  auVar9._16_16_ = auVar7;
  auVar9._0_16_ = auVar6;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5._16_8_ = 0x8000000000000000;
  auVar5._24_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar9,auVar5);
  *(undefined1 (*) [32])
   (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array =
       auVar5;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[4] =
       dVar3;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[5] =
       dVar1;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[6] =
       dVar4;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[7] =
       dVar2;
  return;
}

Assistant:

void ChElementHexaANCF_3813::ShapeFunctionsDerivativeZ(ShapeVector& Nz, double x, double y, double z) {
    double c = GetLengthZ();

    Nz(0) = 2.0 / c * 0.125 * (1.0 - x) * (1.0 - y) * (-1.0);
    Nz(1) = 2.0 / c * 0.125 * (1.0 + x) * (1.0 - y) * (-1.0);
    Nz(2) = 2.0 / c * 0.125 * (1.0 + x) * (1.0 + y) * (-1.0);
    Nz(3) = 2.0 / c * 0.125 * (1.0 - x) * (1.0 + y) * (-1.0);
    Nz(4) = 2.0 / c * 0.125 * (1.0 - x) * (1.0 - y) * (1.0);
    Nz(5) = 2.0 / c * 0.125 * (1.0 + x) * (1.0 - y) * (1.0);
    Nz(6) = 2.0 / c * 0.125 * (1.0 + x) * (1.0 + y) * (1.0);
    Nz(7) = 2.0 / c * 0.125 * (1.0 - x) * (1.0 + y) * (1.0);
}